

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int endpos;
  long lVar4;
  char *pcVar5;
  iterator pcVar6;
  StringPiece *local_1a8;
  StringPiece local_190;
  int local_17c;
  string local_178 [4];
  int count;
  string out;
  iterator local_158;
  char *lastend;
  char *ep;
  char *p;
  undefined1 local_138 [4];
  int nvec;
  StringPiece vec [17];
  StringPiece *rewrite_local;
  RE2 *re_local;
  string *str_local;
  
  local_1a8 = (StringPiece *)local_138;
  vec[0x10]._8_8_ = rewrite;
  do {
    StringPiece::StringPiece(local_1a8);
    local_1a8 = local_1a8 + 1;
  } while (local_1a8 != (StringPiece *)&vec[0x10].length_);
  iVar2 = MaxSubmatch((StringPiece *)vec[0x10]._8_8_);
  iVar2 = iVar2 + 1;
  if (iVar2 < 0x12) {
    ep = (char *)std::__cxx11::string::data();
    lVar4 = std::__cxx11::string::size();
    pcVar5 = ep + lVar4;
    local_158 = (iterator)0x0;
    std::__cxx11::string::string(local_178);
    local_17c = 0;
    while (ep <= pcVar5) {
      StringPiece::StringPiece(&local_190,str);
      iVar3 = std::__cxx11::string::data();
      endpos = std::__cxx11::string::size();
      bVar1 = Match(re,&local_190,(int)ep - iVar3,endpos,UNANCHORED,(StringPiece *)local_138,iVar2);
      if (((bVar1 ^ 0xffU) & 1) != 0) break;
      pcVar6 = StringPiece::begin((StringPiece *)local_138);
      if (ep < pcVar6) {
        StringPiece::begin((StringPiece *)local_138);
        std::__cxx11::string::append((char *)local_178,(ulong)ep);
      }
      pcVar6 = StringPiece::begin((StringPiece *)local_138);
      if ((pcVar6 == local_158) && (iVar3 = StringPiece::size((StringPiece *)local_138), iVar3 == 0)
         ) {
        if (ep < pcVar5) {
          std::__cxx11::string::append((char *)local_178,(ulong)ep);
        }
        ep = ep + 1;
      }
      else {
        Rewrite(re,(string *)local_178,(StringPiece *)vec[0x10]._8_8_,(StringPiece *)local_138,iVar2
               );
        local_158 = StringPiece::end((StringPiece *)local_138);
        local_17c = local_17c + 1;
        ep = local_158;
      }
    }
    if (local_17c == 0) {
      str_local._4_4_ = 0;
    }
    else {
      if (ep < pcVar5) {
        std::__cxx11::string::append((char *)local_178,(ulong)ep);
      }
      std::swap<char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,str)
      ;
      str_local._4_4_ = local_17c;
    }
    std::__cxx11::string::~string(local_178);
  }
  else {
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int RE2::GlobalReplace(string *str,
                      const RE2& re,
                      const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  string out;
  int count = 0;
  while (p <= ep) {
    if (!re.Match(*str, static_cast<int>(p - str->data()),
                  static_cast<int>(str->size()), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].begin())
      out.append(p, vec[0].begin() - p);
    if (vec[0].begin() == lastend && vec[0].size() == 0) {
      // Disallow empty match at end of last match: skip ahead.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].end();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  swap(out, *str);
  return count;
}